

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_omac_ctrl_str(EVP_PKEY_CTX *ctx,char *type,char *value,size_t max_size)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  void *in_RCX;
  char *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  long size;
  char *endptr;
  uchar *keybuf;
  int ret;
  long keylen;
  char *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  char *local_48;
  void *local_40;
  int local_34;
  size_t in_stack_ffffffffffffffd0;
  int local_4;
  
  iVar1 = strcmp((char *)in_RSI,"key");
  if (iVar1 == 0) {
    sVar2 = strlen(in_RDX);
    if (sVar2 == 0x20) {
      local_4 = pkey_gost_mac_ctrl(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,in_RCX);
    }
    else {
      ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8,0);
      local_4 = 0;
    }
  }
  else {
    iVar1 = strcmp((char *)in_RSI,"hexkey");
    if (iVar1 == 0) {
      local_40 = (void *)OPENSSL_hexstr2buf(in_RDX,&stack0xffffffffffffffd0);
      if ((local_40 == (void *)0x0) || (in_stack_ffffffffffffffd0 != 0x20)) {
        ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                       (int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
        CRYPTO_free(local_40);
        local_4 = 0;
      }
      else {
        local_34 = pkey_gost_mac_ctrl(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,in_RCX);
        CRYPTO_free(local_40);
        local_4 = local_34;
      }
    }
    else {
      iVar1 = strcmp((char *)in_RSI,"size");
      if (iVar1 == 0) {
        lVar3 = strtol(in_RDX,&local_48,10);
        if (*local_48 == '\0') {
          local_4 = pkey_gost_omac_ctrl(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,in_RCX,
                                        in_stack_ffffffffffffffd0);
        }
        else {
          ERR_GOST_error((int)((ulong)lVar3 >> 0x20),(int)lVar3,in_stack_ffffffffffffffa8,0);
          local_4 = 0;
        }
      }
      else {
        local_4 = -2;
      }
    }
  }
  return local_4;
}

Assistant:

static int pkey_gost_omac_ctrl_str(EVP_PKEY_CTX *ctx,
                                  const char *type, const char *value, size_t max_size)
{
    if (strcmp(type, key_ctrl_string) == 0) {
        if (strlen(value) != 32) {
            GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL_STR,
                    GOST_R_INVALID_MAC_KEY_LENGTH);
            return 0;
        }
        return pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_SET_MAC_KEY,
                                  32, (char *)value);
    }
    if (strcmp(type, hexkey_ctrl_string) == 0) {
        long keylen;
        int ret;
        unsigned char *keybuf = string_to_hex(value, &keylen);
        if (!keybuf || keylen != 32) {
            GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL_STR,
                    GOST_R_INVALID_MAC_KEY_LENGTH);
            OPENSSL_free(keybuf);
            return 0;
        }
        ret = pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_SET_MAC_KEY, 32, keybuf);
        OPENSSL_free(keybuf);
        return ret;

    }
    if (!strcmp(type, maclen_ctrl_string)) {
        char *endptr;
        long size = strtol(value, &endptr, 10);
        if (*endptr != '\0') {
            GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL_STR, GOST_R_INVALID_MAC_SIZE);
            return 0;
        }
        return pkey_gost_omac_ctrl(ctx, EVP_PKEY_CTRL_MAC_LEN, size, NULL, max_size);
    }
    return -2;
}